

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

CodeLocation __thiscall
soul::SourceCodeUtilities::findNextOccurrence
          (SourceCodeUtilities *this,CodeLocation *start,char character)

{
  UnicodeChar UVar1;
  UTF8Reader extraout_RDX;
  SourceCodeText *o;
  CodeLocation CVar2;
  UTF8Reader UStack_20;
  
  o = (start->sourceCode).object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  UStack_20.data = (start->location).data;
  do {
    UVar1 = UTF8Reader::operator*(&UStack_20);
    if (UVar1 == (int)character) {
      *(SourceCodeText **)this = o;
      *(char **)(this + 8) = UStack_20.data;
      o = (SourceCodeText *)0x0;
LAB_001b10b1:
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
      CVar2.location.data = extraout_RDX.data;
      CVar2.sourceCode.object = (SourceCodeText *)this;
      return CVar2;
    }
    if (UVar1 == 0) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      goto LAB_001b10b1;
    }
    UTF8Reader::operator++(&UStack_20);
  } while( true );
}

Assistant:

CodeLocation SourceCodeUtilities::findNextOccurrence (CodeLocation start, char character)
{
    for (auto pos = start;; ++(pos.location))
    {
        auto c = *(pos.location);

        if (c == static_cast<decltype(c)> (character))
            return pos;

        if (c == 0)
            return {};
    }
}